

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateArgMaxLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  undefined8 layer_00;
  bool bVar1;
  int iVar2;
  Result *pRVar3;
  ArgMaxLayerParams *pAVar4;
  Tensor *this_00;
  int64 iVar5;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  string err;
  int rank;
  ArgMaxLayerParams *params;
  string local_f0;
  Result local_d0;
  Result local_a8;
  undefined4 local_80;
  Result local_70;
  undefined1 local_48 [8];
  Result r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r.m_message.field_2._8_8_ = layer;
  Result::Result((Result *)local_48);
  validateInputCount(&local_70,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
  pRVar3 = Result::operator=((Result *)local_48,&local_70);
  bVar1 = Result::good(pRVar3);
  Result::~Result(&local_70);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    validateOutputCount(&local_a8,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
    pRVar3 = Result::operator=((Result *)local_48,&local_a8);
    bVar1 = Result::good(pRVar3);
    Result::~Result(&local_a8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pAVar4 = Specification::NeuralNetworkLayer::argmax
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      bVar1 = Specification::ArgMaxLayerParams::removedim(pAVar4);
      layer_00 = r.m_message.field_2._8_8_;
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_f0,"ArgMax",(allocator *)((long)&params + 7));
        validateInputOutputRankEquality
                  (&local_d0,(NeuralNetworkLayer *)layer_00,&local_f0,&this->blobNameToRank);
        pRVar3 = Result::operator=((Result *)local_48,&local_d0);
        bVar1 = Result::good(pRVar3);
        Result::~Result(&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          Result::Result(__return_storage_ptr__,(Result *)local_48);
          local_80 = 1;
          goto LAB_00a434f1;
        }
      }
      iVar2 = Specification::NeuralNetworkLayer::inputtensor_size
                        ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      if (0 < iVar2) {
        pAVar4 = Specification::NeuralNetworkLayer::argmax
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        this_00 = Specification::NeuralNetworkLayer::inputtensor
                            ((NeuralNetworkLayer *)r.m_message.field_2._8_8_,0);
        err.field_2._12_4_ = Specification::Tensor::rank(this_00);
        iVar5 = Specification::ArgMaxLayerParams::axis(pAVar4);
        if ((iVar5 < (int)-err.field_2._12_4_) ||
           (iVar5 = Specification::ArgMaxLayerParams::axis(pAVar4), (int)err.field_2._12_4_ <= iVar5
           )) {
          __rhs = Specification::NeuralNetworkLayer::name_abi_cxx11_
                            ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
          std::operator+(&local_148,
                         "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'",
                         __rhs);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128,&local_148,"\' layer.");
          std::__cxx11::string::~string((string *)&local_148);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_128);
          local_80 = 1;
          std::__cxx11::string::~string((string *)local_128);
          goto LAB_00a434f1;
        }
      }
      Result::Result(__return_storage_ptr__);
      local_80 = 1;
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_80 = 1;
    }
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_80 = 1;
  }
LAB_00a434f1:
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateArgMaxLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (!(r = validateInputCount(layer, 1, 1)).good()) return r;
    if (!(r = validateOutputCount(layer, 1, 1)).good()) return r;
    if (!layer.argmax().removedim()) {
        if (!(r = validateInputOutputRankEquality(layer, "ArgMax", blobNameToRank)).good()) return r;
    }
    if (layer.inputtensor_size() > 0) {
        const auto& params = layer.argmax();
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}